

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite.cpp
# Opt level: O2

void __thiscall wallet::SQLiteBatch::Close(SQLiteBatch *this)

{
  bool bVar1;
  int iVar2;
  type *stmt_prepared;
  pointer ppVar3;
  long in_FS_OFFSET;
  initializer_list<std::pair<sqlite3_stmt_**,_const_char_*>_> __l;
  string_view logging_function;
  string_view logging_function_00;
  string_view logging_function_01;
  string_view source_file;
  string_view source_file_00;
  string_view source_file_01;
  allocator_type local_a1;
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  statements;
  pair<sqlite3_stmt_**,_const_char_*> local_88;
  sqlite3_stmt **local_78;
  char *local_70;
  sqlite3_stmt **local_68;
  char *local_60;
  sqlite3_stmt **local_58;
  char *local_50;
  sqlite3_stmt **local_48;
  char *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->m_txn == true) {
    iVar2 = (*(this->super_DatabaseBatch)._vptr_DatabaseBatch[0xd])(this);
    if ((char)iVar2 == '\0') {
      logging_function_00._M_str = "Close";
      logging_function_00._M_len = 5;
      source_file_00._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file_00._M_len = 0x61;
      LogPrintFormatInternal<>
                (logging_function_00,source_file_00,0x1a5,ALL,Info,
                 (ConstevalFormatString<0U>)0x3f294e);
      bVar1 = true;
      goto LAB_001ae37e;
    }
    logging_function._M_str = "Close";
    logging_function._M_len = 5;
    source_file._M_str =
         "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
    ;
    source_file._M_len = 0x61;
    LogPrintFormatInternal<>
              (logging_function,source_file,0x19f,ALL,Info,(ConstevalFormatString<0U>)0x3f28e8);
  }
  bVar1 = false;
LAB_001ae37e:
  local_88.first = &this->m_read_stmt;
  local_88.second = "read";
  local_78 = &this->m_insert_stmt;
  local_70 = "insert";
  local_68 = &this->m_overwrite_stmt;
  local_60 = "overwrite";
  local_58 = &this->m_delete_stmt;
  local_50 = "delete";
  local_48 = &this->m_delete_prefix_stmt;
  local_40 = "delete prefix";
  __l._M_len = 5;
  __l._M_array = &local_88;
  std::
  vector<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::vector(&statements,__l,&local_a1);
  for (ppVar3 = statements.
                super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      ppVar3 != statements.
                super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; ppVar3 = ppVar3 + 1) {
    iVar2 = sqlite3_finalize(*ppVar3->first);
    if (iVar2 != 0) {
      local_88.first = (sqlite3_stmt **)sqlite3_errstr(iVar2);
      logging_function_01._M_str = "Close";
      logging_function_01._M_len = 5;
      source_file_01._M_str =
           "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/wallet/sqlite.cpp"
      ;
      source_file_01._M_len = 0x61;
      LogPrintFormatInternal<char_const*,char_const*>
                (logging_function_01,source_file_01,0x1b6,ALL,Info,
                 (ConstevalFormatString<2U>)0x3f29c8,&ppVar3->second,(char **)&local_88);
    }
    *ppVar3->first = (sqlite3_stmt *)0x0;
  }
  if (bVar1) {
    (*(this->m_database->super_WalletDatabase)._vptr_WalletDatabase[8])();
    (*(this->m_database->super_WalletDatabase)._vptr_WalletDatabase[2])();
    CSemaphore::post(&this->m_database->m_write_semaphore);
  }
  std::
  _Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
  ::~_Vector_base(&statements.
                   super__Vector_base<std::pair<sqlite3_stmt_**,_const_char_*>,_std::allocator<std::pair<sqlite3_stmt_**,_const_char_*>_>_>
                 );
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void SQLiteBatch::Close()
{
    bool force_conn_refresh = false;

    // If we began a transaction, and it wasn't committed, abort the transaction in progress
    if (m_txn) {
        if (TxnAbort()) {
            LogPrintf("SQLiteBatch: Batch closed unexpectedly without the transaction being explicitly committed or aborted\n");
        } else {
            // If transaction cannot be aborted, it means there is a bug or there has been data corruption. Try to recover in this case
            // by closing and reopening the database. Closing the database should also ensure that any changes made since the transaction
            // was opened will be rolled back and future transactions can succeed without committing old data.
            force_conn_refresh = true;
            LogPrintf("SQLiteBatch: Batch closed and failed to abort transaction, resetting db connection..\n");
        }
    }

    // Free all of the prepared statements
    const std::vector<std::pair<sqlite3_stmt**, const char*>> statements{
        {&m_read_stmt, "read"},
        {&m_insert_stmt, "insert"},
        {&m_overwrite_stmt, "overwrite"},
        {&m_delete_stmt, "delete"},
        {&m_delete_prefix_stmt, "delete prefix"},
    };

    for (const auto& [stmt_prepared, stmt_description] : statements) {
        int res = sqlite3_finalize(*stmt_prepared);
        if (res != SQLITE_OK) {
            LogPrintf("SQLiteBatch: Batch closed but could not finalize %s statement: %s\n",
                      stmt_description, sqlite3_errstr(res));
        }
        *stmt_prepared = nullptr;
    }

    if (force_conn_refresh) {
        m_database.Close();
        try {
            m_database.Open();
            // If TxnAbort failed and we refreshed the connection, the semaphore was not released, so release it here to avoid deadlocks on future writes.
            m_database.m_write_semaphore.post();
        } catch (const std::runtime_error&) {
            // If open fails, cleanup this object and rethrow the exception
            m_database.Close();
            throw;
        }
    }
}